

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.hpp
# Opt level: O0

void boost::xpressive::detail::
     make_repeat<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
               (quant_spec *spec,
               sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *seq,int mark_nbr)

{
  int in_EDX;
  uint *in_RDI;
  repeat_end_matcher<mpl_::bool_<false>_> repeat_end_1;
  repeat_end_matcher<mpl_::bool_<true>_> repeat_end;
  repeat_begin_matcher repeat_begin;
  uint min;
  sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdc8;
  sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar1;
  sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdd0;
  uint local_224;
  sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffde0;
  sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffde8;
  repeat_end_matcher<mpl_::bool_<true>_> *in_stack_fffffffffffffdf8;
  sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8 [3];
  uint in_stack_fffffffffffffec4;
  sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffec8;
  quant_spec *in_stack_fffffffffffffed0;
  sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0 [3];
  repeat_end_matcher<mpl_::bool_<true>_> local_38;
  repeat_begin_matcher local_1c;
  uint local_18;
  int local_14;
  uint *local_8;
  
  local_8 = in_RDI;
  if (1 < in_RDI[1]) {
    if (*in_RDI == 0) {
      local_224 = 1;
    }
    else {
      local_224 = *in_RDI;
    }
    local_18 = local_224;
    local_14 = in_EDX;
    repeat_begin_matcher::repeat_begin_matcher(&local_1c,in_EDX);
    if ((local_8[2] & 1) == 0) {
      repeat_end_matcher<mpl_::bool_<false>_>::repeat_end_matcher
                ((repeat_end_matcher<mpl_::bool_<false>_> *)&stack0xfffffffffffffec0,local_14,
                 local_18,local_8[1]);
      psVar1 = local_1e8;
      make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::repeat_begin_matcher>
                ((repeat_begin_matcher *)in_stack_fffffffffffffdf8);
      operator+(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::repeat_end_matcher<mpl_::bool_<false>>>
                ((repeat_end_matcher<mpl_::bool_<false>_> *)in_stack_fffffffffffffdf8);
      operator+(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(in_stack_fffffffffffffdd0,psVar1);
      sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~sequence(in_stack_fffffffffffffdd0);
      sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~sequence(in_stack_fffffffffffffdd0);
      sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~sequence(in_stack_fffffffffffffdd0);
      sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~sequence(in_stack_fffffffffffffdd0);
    }
    else {
      repeat_end_matcher<mpl_::bool_<true>_>::repeat_end_matcher
                (&local_38,local_14,local_18,local_8[1]);
      psVar1 = local_e0;
      make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::repeat_begin_matcher>
                ((repeat_begin_matcher *)in_stack_fffffffffffffdf8);
      operator+(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::repeat_end_matcher<mpl_::bool_<true>>>
                (in_stack_fffffffffffffdf8);
      operator+(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(psVar1,in_stack_fffffffffffffdc8);
      sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~sequence(psVar1);
      sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~sequence(psVar1);
      sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~sequence(psVar1);
      sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~sequence(psVar1);
    }
  }
  if (*local_8 == 0) {
    make_optional<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
  }
  return;
}

Assistant:

inline void
make_repeat(quant_spec const &spec, sequence<BidiIter> &seq, int mark_nbr)
{
    BOOST_ASSERT(spec.max_); // we should never get here if max is 0

    // only bother creating a repeater if max is greater than one
    if(1 < spec.max_)
    {
        // TODO: statically bind the repeat matchers to the mark matchers for better perf
        unsigned int min = spec.min_ ? spec.min_ : 1U;
        repeat_begin_matcher repeat_begin(mark_nbr);
        if(spec.greedy_)
        {
            repeat_end_matcher<mpl::true_> repeat_end(mark_nbr, min, spec.max_);
            seq = make_dynamic<BidiIter>(repeat_begin) + seq
                + make_dynamic<BidiIter>(repeat_end);
        }
        else
        {
            repeat_end_matcher<mpl::false_> repeat_end(mark_nbr, min, spec.max_);
            seq = make_dynamic<BidiIter>(repeat_begin) + seq
                + make_dynamic<BidiIter>(repeat_end);
        }
    }

    // if min is 0, the repeat must be made optional
    if(0 == spec.min_)
    {
        make_optional(spec, seq, mark_nbr);
    }
}